

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_0::imageFormatProperties
          (TestStatus *__return_storage_ptr__,Context *context,VkFormat format,VkImageType imageType
          ,VkImageTiling tiling)

{
  bool bVar1;
  VkImageCreateFlags VVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  qpTestResult code;
  TestContext *this;
  TestLog *log_00;
  VkPhysicalDeviceFeatures *deviceFeatures_00;
  VkPhysicalDeviceProperties *pVVar6;
  InstanceInterface *pIVar7;
  VkPhysicalDevice pVVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extensionStrings;
  MessageBuilder *pMVar9;
  Enum<vk::VkImageType,_4UL> EVar10;
  Enum<vk::VkImageTiling,_4UL> EVar11;
  VkFormatProperties VVar12;
  bool local_c22;
  bool local_c12;
  bool local_bf3;
  bool local_bf2;
  bool local_be3;
  bool local_be2;
  bool local_bd2;
  bool local_bac;
  bool local_bab;
  bool local_baa;
  bool local_b9a;
  bool local_b8b;
  bool local_b8a;
  bool local_b7b;
  bool local_b7a;
  bool local_b6a;
  bool local_b69;
  VkFormatFeatureFlags local_aa8;
  string local_a78;
  string local_a58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a38;
  allocator<char> local_a11;
  string local_a10;
  allocator<char> local_9e9;
  string local_9e8;
  allocator<char> local_9c1;
  string local_9c0;
  allocator<char> local_999;
  string local_998;
  allocator<char> local_971;
  string local_970;
  allocator<char> local_949;
  string local_948;
  allocator<char> local_921;
  string local_920;
  allocator<char> local_8f9;
  string local_8f8;
  MessageBuilder local_8d8;
  allocator<char> local_751;
  string local_750;
  allocator<char> local_729;
  string local_728;
  allocator<char> local_701;
  string local_700;
  allocator<char> local_6d9;
  string local_6d8;
  allocator<char> local_6b1;
  string local_6b0;
  allocator<char> local_689;
  string local_688;
  allocator<char> local_661;
  string local_660;
  allocator<char> local_639;
  string local_638;
  allocator<char> local_611;
  string local_610;
  allocator<char> local_5e9;
  string local_5e8;
  allocator<char> local_5c1;
  string local_5c0;
  VkSampleCountFlags local_5a0;
  bool local_59a;
  allocator<char> local_599;
  VkSampleCountFlags requiredSampleCounts;
  bool requiredByNewSpec;
  allocator<char> local_571;
  string local_570;
  allocator<char> local_549;
  string local_548;
  allocator<char> local_521;
  string local_520;
  MessageBuilder local_500;
  deUint32 local_37c;
  undefined1 local_378 [4];
  deUint32 fullMipPyramidSize;
  Bitfield<32UL> local_360;
  GetNameFunc local_348;
  VkImageTiling local_340;
  Enum<vk::VkImageTiling,_4UL> local_338;
  GetNameFunc local_328;
  VkImageType local_320;
  Enum<vk::VkImageType,_4UL> local_318;
  MessageBuilder local_308;
  VkResult local_184;
  undefined1 local_180 [4];
  VkResult queryResult;
  VkImageFormatProperties properties;
  uint local_158;
  bool isRequiredCombination;
  VkImageCreateFlags curCreateFlags;
  VkImageCreateFlags createFlagSet;
  VkImageUsageFlags curUsageFlags;
  allocator<char> local_121;
  string local_120;
  undefined1 local_100 [8];
  ResultCollector results;
  VkImageUsageFlags usageFlagSet;
  VkFormatFeatureFlags supportedFeatures;
  allocator<char> local_91;
  string local_90;
  byte local_69;
  undefined1 auStack_68 [7];
  bool hasKhrMaintenance1;
  VkFormatFeatureFlags local_60;
  undefined1 local_58 [8];
  VkFormatProperties formatProperties;
  VkPhysicalDeviceLimits *deviceLimits;
  VkPhysicalDeviceFeatures *deviceFeatures;
  TestLog *log;
  VkImageTiling tiling_local;
  VkImageType imageType_local;
  VkFormat format_local;
  Context *context_local;
  
  this = Context::getTestContext(context);
  log_00 = tcu::TestContext::getLog(this);
  deviceFeatures_00 = Context::getDeviceFeatures(context);
  pVVar6 = Context::getDeviceProperties(context);
  register0x00000000 = &pVVar6->limits;
  pIVar7 = Context::getInstanceInterface(context);
  pVVar8 = Context::getPhysicalDevice(context);
  VVar12 = ::vk::getPhysicalDeviceFormatProperties(pIVar7,pVVar8,format);
  local_60 = VVar12.bufferFeatures;
  formatProperties.linearTilingFeatures = local_60;
  _auStack_68 = VVar12._0_8_;
  local_58._0_4_ = auStack_68._0_4_;
  local_58._4_4_ = stack0xffffffffffffff9c;
  _auStack_68 = VVar12;
  extensionStrings = Context::getDeviceExtensions_abi_cxx11_(context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"VK_KHR_maintenance1",&local_91);
  bVar1 = isExtensionSupported(extensionStrings,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  if (tiling == VK_IMAGE_TILING_LINEAR) {
    local_aa8 = local_58._0_4_;
  }
  else {
    local_aa8 = local_58._4_4_;
  }
  local_69 = bVar1;
  results.m_message.field_2._12_4_ = getValidImageUsageFlags(local_aa8,bVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"ERROR: ",&local_121);
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_100,log_00,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator(&local_121);
  if (((local_69 & 1) != 0) && ((local_aa8 & 1) != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&curUsageFlags,
               "A sampled image format must have VK_FORMAT_FEATURE_TRANSFER_SRC_BIT_KHR and VK_FORMAT_FEATURE_TRANSFER_DST_BIT_KHR format feature flags set"
               ,(allocator<char> *)((long)&createFlagSet + 3));
    tcu::ResultCollector::check
              ((ResultCollector *)local_100,(local_aa8 & 0xc000) != 0,(string *)&curUsageFlags);
    std::__cxx11::string::~string((string *)&curUsageFlags);
    std::allocator<char>::~allocator((allocator<char> *)((long)&createFlagSet + 3));
  }
  for (curCreateFlags = 0; curCreateFlags <= (uint)results.m_message.field_2._12_4_;
      curCreateFlags = curCreateFlags + 1) {
    if (((curCreateFlags & (results.m_message.field_2._12_4_ ^ 0xffffffff)) == 0) &&
       (bVar1 = isValidImageUsageFlagCombination(curCreateFlags), bVar1)) {
      VVar2 = getValidImageCreateFlags(deviceFeatures_00,format,local_aa8,imageType,curCreateFlags);
      for (local_158 = 0; local_158 <= VVar2; local_158 = local_158 + 1) {
        if (((local_158 & (VVar2 ^ 0xffffffff)) == 0) &&
           (bVar1 = isValidImageCreateFlagCombination(local_158), bVar1)) {
          properties.maxResourceSize._7_1_ =
               isRequiredImageParameterCombination
                         (deviceFeatures_00,format,(VkFormatProperties *)local_58,imageType,tiling,
                          curCreateFlags,local_158);
          tcu::TestLog::operator<<(&local_308,log_00,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar9 = tcu::MessageBuilder::operator<<(&local_308,(char (*) [9])"Testing ");
          EVar10 = ::vk::getImageTypeStr(imageType);
          local_328 = EVar10.m_getName;
          local_320 = EVar10.m_value;
          local_318.m_getName = local_328;
          local_318.m_value = local_320;
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_318);
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x132ea91);
          EVar11 = ::vk::getImageTilingStr(tiling);
          local_348 = EVar11.m_getName;
          local_340 = EVar11.m_value;
          local_338.m_getName = local_348;
          local_338.m_value = local_340;
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_338);
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x132ea91);
          ::vk::getImageUsageFlagsStr(&local_360,curCreateFlags);
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_360);
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x132ea91);
          ::vk::getImageCreateFlagsStr((Bitfield<32UL> *)local_378,local_158);
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(Bitfield<32UL> *)local_378);
          tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_308);
          ::deMemset(local_180,0xcd,0x20);
          pIVar7 = Context::getInstanceInterface(context);
          pVVar8 = Context::getPhysicalDevice(context);
          local_184 = (*pIVar7->_vptr_InstanceInterface[4])
                                (pIVar7,pVVar8,(ulong)format,(ulong)imageType,(ulong)tiling,
                                 (ulong)curCreateFlags,local_158,local_180);
          if (local_184 == VK_SUCCESS) {
            iVar3 = deLog2Ceil32((deInt32)local_180);
            iVar4 = deLog2Ceil32(queryResult);
            iVar3 = de::max<int>(iVar3,iVar4);
            iVar4 = deLog2Ceil32(properties.maxExtent.width);
            iVar3 = de::max<int>(iVar3,iVar4);
            local_37c = iVar3 + 1;
            tcu::TestLog::operator<<(&local_500,log_00,(BeginMessageToken *)&tcu::TestLog::Message);
            pMVar9 = tcu::MessageBuilder::operator<<
                               (&local_500,(VkImageFormatProperties *)local_180);
            pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [2])0x134b284);
            tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_500);
            local_b69 = true;
            if (imageType == VK_IMAGE_TYPE_1D) {
              local_b6a = false;
              if ((local_180 != (undefined1  [4])0x0) &&
                 (local_b6a = false, queryResult == VK_NOT_READY)) {
                local_b6a = properties.maxExtent.width == 1;
              }
              local_b69 = local_b6a;
            }
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_520,"Invalid dimensions for 1D image",&local_521);
            tcu::ResultCollector::check((ResultCollector *)local_100,local_b69,&local_520);
            std::__cxx11::string::~string((string *)&local_520);
            std::allocator<char>::~allocator(&local_521);
            local_b7a = true;
            if (imageType == VK_IMAGE_TYPE_2D) {
              local_b7b = false;
              if ((local_180 != (undefined1  [4])0x0) &&
                 (local_b7b = false, queryResult != VK_SUCCESS)) {
                local_b7b = properties.maxExtent.width == 1;
              }
              local_b7a = local_b7b;
            }
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_548,"Invalid dimensions for 2D image",&local_549);
            tcu::ResultCollector::check((ResultCollector *)local_100,local_b7a,&local_548);
            std::__cxx11::string::~string((string *)&local_548);
            std::allocator<char>::~allocator(&local_549);
            local_b8a = true;
            if (imageType == VK_IMAGE_TYPE_3D) {
              local_b8b = false;
              if ((local_180 != (undefined1  [4])0x0) &&
                 (local_b8b = false, queryResult != VK_SUCCESS)) {
                local_b8b = properties.maxExtent.width != 0;
              }
              local_b8a = local_b8b;
            }
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_570,"Invalid dimensions for 3D image",&local_571);
            tcu::ResultCollector::check((ResultCollector *)local_100,local_b8a,&local_570);
            std::__cxx11::string::~string((string *)&local_570);
            std::allocator<char>::~allocator(&local_571);
            local_b9a = imageType != VK_IMAGE_TYPE_3D || properties.maxExtent.depth == 1;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&requiredSampleCounts,"Invalid maxArrayLayers for 3D image",
                       &local_599);
            tcu::ResultCollector::check
                      ((ResultCollector *)local_100,local_b9a,(string *)&requiredSampleCounts);
            std::__cxx11::string::~string((string *)&requiredSampleCounts);
            std::allocator<char>::~allocator(&local_599);
            if (tiling == VK_IMAGE_TILING_OPTIMAL) {
              local_baa = false;
              if ((imageType == VK_IMAGE_TYPE_2D) && (local_baa = false, (local_158 & 0x10) == 0)) {
                local_bab = true;
                if ((local_aa8 & 0x280) == 0) {
                  local_bac = false;
                  if ((local_aa8 & 2) != 0) {
                    local_bac = deviceFeatures_00->shaderStorageImageMultisample != 0;
                  }
                  local_bab = local_bac;
                }
                local_baa = local_bab;
              }
              local_59a = local_baa;
              if (local_baa == false) {
                if (properties.maxMipLevels != 1) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_5e8,
                             "Implementation supports more sample counts than allowed by the spec",
                             &local_5e9);
                  tcu::ResultCollector::addResult
                            ((ResultCollector *)local_100,QP_TEST_RESULT_COMPATIBILITY_WARNING,
                             &local_5e8);
                  std::__cxx11::string::~string((string *)&local_5e8);
                  std::allocator<char>::~allocator(&local_5e9);
                }
              }
              else {
                local_5a0 = getRequiredOptimalTilingSampleCounts
                                      (stack0xffffffffffffffb8,format,curCreateFlags);
                uVar5 = local_5a0 & ~properties.maxMipLevels;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_5c0,"Required sample counts not supported",&local_5c1);
                tcu::ResultCollector::check((ResultCollector *)local_100,uVar5 == 0,&local_5c0);
                std::__cxx11::string::~string((string *)&local_5c0);
                std::allocator<char>::~allocator(&local_5c1);
              }
            }
            else {
              bVar1 = properties.maxMipLevels == 1;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_610,"sampleCounts != VK_SAMPLE_COUNT_1_BIT",&local_611);
              tcu::ResultCollector::check((ResultCollector *)local_100,bVar1,&local_610);
              std::__cxx11::string::~string((string *)&local_610);
              std::allocator<char>::~allocator(&local_611);
            }
            if ((properties.maxResourceSize._7_1_ & 1) == 0) {
              local_c22 = properties.maxExtent.height == 1 ||
                          properties.maxExtent.height == local_37c;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_700,"Invalid mip pyramid size",&local_701);
              tcu::ResultCollector::check((ResultCollector *)local_100,local_c22,&local_700);
              std::__cxx11::string::~string((string *)&local_700);
              std::allocator<char>::~allocator(&local_701);
              bVar1 = properties.maxExtent.depth != 0;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_728,"Invalid maxArrayLayers",&local_729);
              tcu::ResultCollector::check((ResultCollector *)local_100,bVar1,&local_728);
              std::__cxx11::string::~string((string *)&local_728);
              std::allocator<char>::~allocator(&local_729);
            }
            else {
              local_bd2 = true;
              if (imageType == VK_IMAGE_TYPE_1D) {
                local_bd2 = stack0xffffffffffffffb8->maxImageDimension1D <= (uint)local_180;
              }
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_638,"Reported dimensions smaller than device limits",
                         &local_639);
              tcu::ResultCollector::check((ResultCollector *)local_100,local_bd2,&local_638);
              std::__cxx11::string::~string((string *)&local_638);
              std::allocator<char>::~allocator(&local_639);
              local_be2 = true;
              if (imageType == VK_IMAGE_TYPE_2D) {
                local_be3 = false;
                if (stack0xffffffffffffffb8->maxImageDimension2D <= (uint)local_180) {
                  local_be3 = stack0xffffffffffffffb8->maxImageDimension2D <= (uint)queryResult;
                }
                local_be2 = local_be3;
              }
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_660,"Reported dimensions smaller than device limits",
                         &local_661);
              tcu::ResultCollector::check((ResultCollector *)local_100,local_be2,&local_660);
              std::__cxx11::string::~string((string *)&local_660);
              std::allocator<char>::~allocator(&local_661);
              local_bf2 = true;
              if (imageType == VK_IMAGE_TYPE_3D) {
                local_bf3 = false;
                if ((stack0xffffffffffffffb8->maxImageDimension3D <= (uint)local_180) &&
                   (local_bf3 = false,
                   stack0xffffffffffffffb8->maxImageDimension3D <= (uint)queryResult)) {
                  local_bf3 = stack0xffffffffffffffb8->maxImageDimension3D <=
                              properties.maxExtent.width;
                }
                local_bf2 = local_bf3;
              }
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_688,"Reported dimensions smaller than device limits",
                         &local_689);
              tcu::ResultCollector::check((ResultCollector *)local_100,local_bf2,&local_688);
              std::__cxx11::string::~string((string *)&local_688);
              std::allocator<char>::~allocator(&local_689);
              bVar1 = properties.maxExtent.height == local_37c;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_6b0,"maxMipLevels is not full mip pyramid size",&local_6b1
                        );
              tcu::ResultCollector::check((ResultCollector *)local_100,bVar1,&local_6b0);
              std::__cxx11::string::~string((string *)&local_6b0);
              std::allocator<char>::~allocator(&local_6b1);
              local_c12 = true;
              if (imageType != VK_IMAGE_TYPE_3D) {
                local_c12 = stack0xffffffffffffffb8->maxImageArrayLayers <=
                            properties.maxExtent.depth;
              }
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_6d8,"maxArrayLayers smaller than device limits",&local_6d9
                        );
              tcu::ResultCollector::check((ResultCollector *)local_100,local_c12,&local_6d8);
              std::__cxx11::string::~string((string *)&local_6d8);
              std::allocator<char>::~allocator(&local_6d9);
            }
            bVar1 = 0x7fffffff < (ulong)properties._16_8_;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_750,"maxResourceSize smaller than minimum required size",
                       &local_751);
            tcu::ResultCollector::check((ResultCollector *)local_100,bVar1,&local_750);
            std::__cxx11::string::~string((string *)&local_750);
            std::allocator<char>::~allocator(&local_751);
          }
          else if (local_184 == VK_ERROR_FORMAT_NOT_SUPPORTED) {
            tcu::TestLog::operator<<(&local_8d8,log_00,(BeginMessageToken *)&tcu::TestLog::Message);
            pMVar9 = tcu::MessageBuilder::operator<<
                               (&local_8d8,(char (*) [34])"Got VK_ERROR_FORMAT_NOT_SUPPORTED");
            tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_8d8);
            if ((properties.maxResourceSize._7_1_ & 1) != 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_8f8,
                         "VK_ERROR_FORMAT_NOT_SUPPORTED returned for required image parameter combination"
                         ,&local_8f9);
              tcu::ResultCollector::fail((ResultCollector *)local_100,&local_8f8);
              std::__cxx11::string::~string((string *)&local_8f8);
              std::allocator<char>::~allocator(&local_8f9);
            }
            bVar1 = local_180 == (undefined1  [4])0x0;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_920,"maxExtent.width != 0",&local_921);
            tcu::ResultCollector::check((ResultCollector *)local_100,bVar1,&local_920);
            std::__cxx11::string::~string((string *)&local_920);
            std::allocator<char>::~allocator(&local_921);
            bVar1 = queryResult == VK_SUCCESS;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_948,"maxExtent.height != 0",&local_949);
            tcu::ResultCollector::check((ResultCollector *)local_100,bVar1,&local_948);
            std::__cxx11::string::~string((string *)&local_948);
            std::allocator<char>::~allocator(&local_949);
            bVar1 = properties.maxExtent.width == 0;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_970,"maxExtent.depth != 0",&local_971);
            tcu::ResultCollector::check((ResultCollector *)local_100,bVar1,&local_970);
            std::__cxx11::string::~string((string *)&local_970);
            std::allocator<char>::~allocator(&local_971);
            bVar1 = properties.maxExtent.height == 0;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_998,"maxMipLevels != 0",&local_999);
            tcu::ResultCollector::check((ResultCollector *)local_100,bVar1,&local_998);
            std::__cxx11::string::~string((string *)&local_998);
            std::allocator<char>::~allocator(&local_999);
            bVar1 = properties.maxExtent.depth == 0;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_9c0,"maxArrayLayers != 0",&local_9c1);
            tcu::ResultCollector::check((ResultCollector *)local_100,bVar1,&local_9c0);
            std::__cxx11::string::~string((string *)&local_9c0);
            std::allocator<char>::~allocator(&local_9c1);
            bVar1 = properties.maxMipLevels == 0;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_9e8,"sampleCounts != 0",&local_9e9);
            tcu::ResultCollector::check((ResultCollector *)local_100,bVar1,&local_9e8);
            std::__cxx11::string::~string((string *)&local_9e8);
            std::allocator<char>::~allocator(&local_9e9);
            bVar1 = properties._16_8_ == 0;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_a10,"maxResourceSize != 0",&local_a11);
            tcu::ResultCollector::check((ResultCollector *)local_100,bVar1,&local_a10);
            std::__cxx11::string::~string((string *)&local_a10);
            std::allocator<char>::~allocator(&local_a11);
          }
          else {
            de::toString<vk::VkResult>(&local_a58,&local_184);
            std::operator+(&local_a38,"Got unexpected error",&local_a58);
            tcu::ResultCollector::fail((ResultCollector *)local_100,&local_a38);
            std::__cxx11::string::~string((string *)&local_a38);
            std::__cxx11::string::~string((string *)&local_a58);
          }
        }
      }
    }
  }
  code = tcu::ResultCollector::getResult((ResultCollector *)local_100);
  tcu::ResultCollector::getMessage_abi_cxx11_(&local_a78,(ResultCollector *)local_100);
  tcu::TestStatus::TestStatus(__return_storage_ptr__,code,&local_a78);
  std::__cxx11::string::~string((string *)&local_a78);
  tcu::ResultCollector::~ResultCollector((ResultCollector *)local_100);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus imageFormatProperties (Context& context, const VkFormat format, const VkImageType imageType, const VkImageTiling tiling)
{
	TestLog&						log					= context.getTestContext().getLog();
	const VkPhysicalDeviceFeatures&	deviceFeatures		= context.getDeviceFeatures();
	const VkPhysicalDeviceLimits&	deviceLimits		= context.getDeviceProperties().limits;
	const VkFormatProperties		formatProperties	= getPhysicalDeviceFormatProperties(context.getInstanceInterface(), context.getPhysicalDevice(), format);
	const bool						hasKhrMaintenance1	= isExtensionSupported(context.getDeviceExtensions(), "VK_KHR_maintenance1");

	const VkFormatFeatureFlags		supportedFeatures	= tiling == VK_IMAGE_TILING_LINEAR ? formatProperties.linearTilingFeatures : formatProperties.optimalTilingFeatures;
	const VkImageUsageFlags			usageFlagSet		= getValidImageUsageFlags(supportedFeatures, hasKhrMaintenance1);

	tcu::ResultCollector			results				(log, "ERROR: ");

	if (hasKhrMaintenance1 && (supportedFeatures & VK_FORMAT_FEATURE_SAMPLED_IMAGE_BIT) != 0)
	{
		results.check((supportedFeatures & (VK_FORMAT_FEATURE_TRANSFER_SRC_BIT_KHR | VK_FORMAT_FEATURE_TRANSFER_DST_BIT_KHR)) != 0,
					  "A sampled image format must have VK_FORMAT_FEATURE_TRANSFER_SRC_BIT_KHR and VK_FORMAT_FEATURE_TRANSFER_DST_BIT_KHR format feature flags set");
	}

	for (VkImageUsageFlags curUsageFlags = 0; curUsageFlags <= usageFlagSet; curUsageFlags++)
	{
		if ((curUsageFlags & ~usageFlagSet) != 0 ||
			!isValidImageUsageFlagCombination(curUsageFlags))
			continue;

		const VkImageCreateFlags	createFlagSet		= getValidImageCreateFlags(deviceFeatures, format, supportedFeatures, imageType, curUsageFlags);

		for (VkImageCreateFlags curCreateFlags = 0; curCreateFlags <= createFlagSet; curCreateFlags++)
		{
			if ((curCreateFlags & ~createFlagSet) != 0 ||
				!isValidImageCreateFlagCombination(curCreateFlags))
				continue;

			const bool				isRequiredCombination	= isRequiredImageParameterCombination(deviceFeatures,
																								  format,
																								  formatProperties,
																								  imageType,
																								  tiling,
																								  curUsageFlags,
																								  curCreateFlags);
			VkImageFormatProperties	properties;
			VkResult				queryResult;

			log << TestLog::Message << "Testing " << getImageTypeStr(imageType) << ", "
									<< getImageTilingStr(tiling) << ", "
									<< getImageUsageFlagsStr(curUsageFlags) << ", "
									<< getImageCreateFlagsStr(curCreateFlags)
				<< TestLog::EndMessage;

			// Set return value to known garbage
			deMemset(&properties, 0xcd, sizeof(properties));

			queryResult = context.getInstanceInterface().getPhysicalDeviceImageFormatProperties(context.getPhysicalDevice(),
																								format,
																								imageType,
																								tiling,
																								curUsageFlags,
																								curCreateFlags,
																								&properties);

			if (queryResult == VK_SUCCESS)
			{
				const deUint32	fullMipPyramidSize	= de::max(de::max(deLog2Ceil32(properties.maxExtent.width),
																	  deLog2Ceil32(properties.maxExtent.height)),
															  deLog2Ceil32(properties.maxExtent.depth)) + 1;

				log << TestLog::Message << properties << "\n" << TestLog::EndMessage;

				results.check(imageType != VK_IMAGE_TYPE_1D || (properties.maxExtent.width >= 1 && properties.maxExtent.height == 1 && properties.maxExtent.depth == 1), "Invalid dimensions for 1D image");
				results.check(imageType != VK_IMAGE_TYPE_2D || (properties.maxExtent.width >= 1 && properties.maxExtent.height >= 1 && properties.maxExtent.depth == 1), "Invalid dimensions for 2D image");
				results.check(imageType != VK_IMAGE_TYPE_3D || (properties.maxExtent.width >= 1 && properties.maxExtent.height >= 1 && properties.maxExtent.depth >= 1), "Invalid dimensions for 3D image");
				results.check(imageType != VK_IMAGE_TYPE_3D || properties.maxArrayLayers == 1, "Invalid maxArrayLayers for 3D image");

				if (tiling == VK_IMAGE_TILING_OPTIMAL)
				{
					// Vulkan API specification has changed since initial Android Nougat release.
					// For NYC CTS we need to tolerate old behavior as well and issue compatibility
					// warning instead.
					//
					// See spec issues 272, 282, 302, 445 and CTS issues 369, 440.
					const bool	requiredByNewSpec	= (imageType == VK_IMAGE_TYPE_2D && !(curCreateFlags & VK_IMAGE_CREATE_CUBE_COMPATIBLE_BIT) &&
													  ((supportedFeatures & (VK_FORMAT_FEATURE_DEPTH_STENCIL_ATTACHMENT_BIT | VK_FORMAT_FEATURE_COLOR_ATTACHMENT_BIT)) ||
													  ((supportedFeatures & VK_FORMAT_FEATURE_STORAGE_IMAGE_BIT) && deviceFeatures.shaderStorageImageMultisample)));

					if (requiredByNewSpec)
					{
						const VkSampleCountFlags	requiredSampleCounts	= getRequiredOptimalTilingSampleCounts(deviceLimits, format, curUsageFlags);

						results.check((properties.sampleCounts & requiredSampleCounts) == requiredSampleCounts, "Required sample counts not supported");
					}
					else if (properties.sampleCounts != VK_SAMPLE_COUNT_1_BIT)
					{
						results.addResult(QP_TEST_RESULT_COMPATIBILITY_WARNING,
									      "Implementation supports more sample counts than allowed by the spec");
					}
				}
				else
					results.check(properties.sampleCounts == VK_SAMPLE_COUNT_1_BIT, "sampleCounts != VK_SAMPLE_COUNT_1_BIT");

				if (isRequiredCombination)
				{
					results.check(imageType != VK_IMAGE_TYPE_1D || (properties.maxExtent.width	>= deviceLimits.maxImageDimension1D),
								  "Reported dimensions smaller than device limits");
					results.check(imageType != VK_IMAGE_TYPE_2D || (properties.maxExtent.width	>= deviceLimits.maxImageDimension2D &&
																	properties.maxExtent.height	>= deviceLimits.maxImageDimension2D),
								  "Reported dimensions smaller than device limits");
					results.check(imageType != VK_IMAGE_TYPE_3D || (properties.maxExtent.width	>= deviceLimits.maxImageDimension3D &&
																	properties.maxExtent.height	>= deviceLimits.maxImageDimension3D &&
																	properties.maxExtent.depth	>= deviceLimits.maxImageDimension3D),
								  "Reported dimensions smaller than device limits");
					results.check(properties.maxMipLevels == fullMipPyramidSize, "maxMipLevels is not full mip pyramid size");
					results.check(imageType == VK_IMAGE_TYPE_3D || properties.maxArrayLayers >= deviceLimits.maxImageArrayLayers,
								  "maxArrayLayers smaller than device limits");
				}
				else
				{
					results.check(properties.maxMipLevels == 1 || properties.maxMipLevels == fullMipPyramidSize, "Invalid mip pyramid size");
					results.check(properties.maxArrayLayers >= 1, "Invalid maxArrayLayers");
				}

				results.check(properties.maxResourceSize >= (VkDeviceSize)MINIMUM_REQUIRED_IMAGE_RESOURCE_SIZE,
							  "maxResourceSize smaller than minimum required size");
			}
			else if (queryResult == VK_ERROR_FORMAT_NOT_SUPPORTED)
			{
				log << TestLog::Message << "Got VK_ERROR_FORMAT_NOT_SUPPORTED" << TestLog::EndMessage;

				if (isRequiredCombination)
					results.fail("VK_ERROR_FORMAT_NOT_SUPPORTED returned for required image parameter combination");

				// Specification requires that all fields are set to 0
				results.check(properties.maxExtent.width	== 0, "maxExtent.width != 0");
				results.check(properties.maxExtent.height	== 0, "maxExtent.height != 0");
				results.check(properties.maxExtent.depth	== 0, "maxExtent.depth != 0");
				results.check(properties.maxMipLevels		== 0, "maxMipLevels != 0");
				results.check(properties.maxArrayLayers		== 0, "maxArrayLayers != 0");
				results.check(properties.sampleCounts		== 0, "sampleCounts != 0");
				results.check(properties.maxResourceSize	== 0, "maxResourceSize != 0");
			}
			else
			{
				results.fail("Got unexpected error" + de::toString(queryResult));
			}
		}
	}

	return tcu::TestStatus(results.getResult(), results.getMessage());
}